

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

void tinyobj::LoadMtl(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      *material_map,
                     vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
                     istream *inStream,string *warning,string *err)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  ulong uVar4;
  size_t sVar5;
  size_type sVar6;
  ostream *poVar7;
  real_t rVar8;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_int>_>::value,_pair<iterator,_bool>_>
  _Var9;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_basic_string<char>_>_>::value,_pair<iterator,_bool>_>
  _Var10;
  string local_c98 [32];
  _Base_ptr local_c78;
  undefined1 local_c70;
  int local_c64;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_c60;
  _Base_ptr local_c38;
  undefined1 local_c30;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c28;
  allocator local_be1;
  undefined1 local_be0 [8];
  string value;
  undefined1 local_bb8 [8];
  string key;
  ptrdiff_t len;
  char *_space;
  real_t local_b80;
  real_t b_4;
  real_t g_4;
  real_t r_4;
  real_t b_3;
  real_t g_3;
  real_t r_3;
  real_t b_2;
  real_t g_2;
  real_t r_2;
  real_t b_1;
  real_t g_1;
  real_t r_1;
  real_t b;
  real_t g;
  real_t r;
  stringstream local_b28 [8];
  stringstream sstr;
  ostream local_b18 [376];
  _Base_ptr local_9a0;
  undefined1 local_998;
  int local_98c;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_988;
  char *local_960;
  char *token;
  undefined1 local_938 [8];
  string linebuf;
  size_t line_no;
  stringstream warn_ss;
  ostream local_900 [377];
  byte local_787;
  byte local_786;
  byte local_785;
  bool has_kd;
  bool has_tr;
  bool has_d;
  undefined1 local_778 [8];
  material_t material;
  string *err_local;
  string *warning_local;
  istream *inStream_local;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *material_map_local;
  
  material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)err;
  material_t::material_t((material_t *)local_778);
  InitMaterial((material_t *)local_778);
  local_785 = 0;
  local_786 = 0;
  local_787 = 0;
  std::__cxx11::stringstream::stringstream((stringstream *)&line_no);
  linebuf.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)local_938);
  while( true ) {
    do {
      iVar1 = std::istream::peek();
      if (iVar1 == -1) {
        sVar6 = std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::size
                          (materials);
        local_c64 = (int)sVar6;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_true>
                  (&local_c60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778,
                   &local_c64);
        _Var9 = std::
                map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                ::insert<std::pair<std::__cxx11::string,int>>
                          ((map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                            *)material_map,&local_c60);
        local_c78 = (_Base_ptr)_Var9.first._M_node;
        local_c70 = _Var9.second;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
        ~pair(&local_c60);
        std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::push_back
                  (materials,(value_type *)local_778);
        if (warning != (string *)0x0) {
          std::__cxx11::stringstream::str();
          std::__cxx11::string::operator=((string *)warning,local_c98);
          std::__cxx11::string::~string(local_c98);
        }
        std::__cxx11::string::~string((string *)local_938);
        std::__cxx11::stringstream::~stringstream((stringstream *)&line_no);
        material_t::~material_t((material_t *)local_778);
        return;
      }
      safeGetline(inStream,(string *)local_938);
      linebuf.field_2._8_8_ = linebuf.field_2._8_8_ + 1;
      lVar2 = std::__cxx11::string::size();
      if (lVar2 != 0) {
        std::__cxx11::string::find_last_not_of(local_938,0x17c640);
        std::__cxx11::string::substr((ulong)&token,(ulong)local_938);
        std::__cxx11::string::operator=((string *)local_938,(string *)&token);
        std::__cxx11::string::~string((string *)&token);
      }
      lVar2 = std::__cxx11::string::size();
      if (lVar2 != 0) {
        std::__cxx11::string::size();
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_938);
        if (*pcVar3 == '\n') {
          lVar2 = std::__cxx11::string::size();
          std::__cxx11::string::erase((ulong)local_938,lVar2 - 1);
        }
      }
      lVar2 = std::__cxx11::string::size();
      if (lVar2 != 0) {
        std::__cxx11::string::size();
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_938);
        if (*pcVar3 == '\r') {
          lVar2 = std::__cxx11::string::size();
          std::__cxx11::string::erase((ulong)local_938,lVar2 - 1);
        }
      }
      uVar4 = std::__cxx11::string::empty();
    } while ((uVar4 & 1) != 0);
    local_960 = (char *)std::__cxx11::string::c_str();
    sVar5 = strspn(local_960," \t");
    local_960 = local_960 + sVar5;
    if (local_960 == (char *)0x0) break;
    if ((*local_960 != '\0') && (*local_960 != '#')) {
      iVar1 = strncmp(local_960,"newmtl",6);
      if ((iVar1 == 0) && ((local_960[6] == ' ' || (local_960[6] == '\t')))) {
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          sVar6 = std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::size
                            (materials);
          local_98c = (int)sVar6;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_true>
                    (&local_988,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778,
                     &local_98c);
          _Var9 = std::
                  map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                  ::insert<std::pair<std::__cxx11::string,int>>
                            ((map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                              *)material_map,&local_988);
          local_9a0 = (_Base_ptr)_Var9.first._M_node;
          local_998 = _Var9.second;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
          ::~pair(&local_988);
          std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::push_back
                    (materials,(value_type *)local_778);
        }
        InitMaterial((material_t *)local_778);
        local_785 = 0;
        local_786 = 0;
        local_960 = local_960 + 7;
        std::__cxx11::stringstream::stringstream(local_b28);
        std::operator<<(local_b18,local_960);
        std::__cxx11::stringstream::str();
        std::__cxx11::string::operator=((string *)local_778,(string *)&g);
        std::__cxx11::string::~string((string *)&g);
        std::__cxx11::stringstream::~stringstream(local_b28);
      }
      else if ((*local_960 == 'K') &&
              ((local_960[1] == 'a' && ((local_960[2] == ' ' || (local_960[2] == '\t')))))) {
        local_960 = local_960 + 2;
        parseReal3(&b,&r_1,&g_1,&local_960,0.0,0.0,0.0);
      }
      else if ((*local_960 == 'K') &&
              ((local_960[1] == 'd' && ((local_960[2] == ' ' || (local_960[2] == '\t')))))) {
        local_960 = local_960 + 2;
        parseReal3(&b_1,&r_2,&g_2,&local_960,0.0,0.0,0.0);
        material.ambient[1] = b_1;
        material.ambient[2] = r_2;
        material.diffuse[0] = g_2;
        local_787 = 1;
      }
      else if ((*local_960 == 'K') &&
              ((local_960[1] == 's' && ((local_960[2] == ' ' || (local_960[2] == '\t')))))) {
        local_960 = local_960 + 2;
        parseReal3(&b_2,&r_3,&g_3,&local_960,0.0,0.0,0.0);
      }
      else if (((*local_960 == 'K') &&
               ((local_960[1] == 't' && ((local_960[2] == ' ' || (local_960[2] == '\t')))))) ||
              ((*local_960 == 'T' &&
               ((local_960[1] == 'f' && ((local_960[2] == ' ' || (local_960[2] == '\t')))))))) {
        local_960 = local_960 + 2;
        parseReal3(&b_3,&r_4,&g_4,&local_960,0.0,0.0,0.0);
      }
      else if (((*local_960 == 'N') && (local_960[1] == 'i')) &&
              ((local_960[2] == ' ' || (local_960[2] == '\t')))) {
        local_960 = local_960 + 2;
        material.emission[2] = parseReal(&local_960,0.0);
      }
      else if (((*local_960 == 'K') && (local_960[1] == 'e')) &&
              ((local_960[2] == ' ' || (local_960[2] == '\t')))) {
        local_960 = local_960 + 2;
        parseReal3(&b_4,&local_b80,(real_t *)((long)&_space + 4),&local_960,0.0,0.0,0.0);
      }
      else if (((*local_960 == 'N') && (local_960[1] == 's')) &&
              ((local_960[2] == ' ' || (local_960[2] == '\t')))) {
        local_960 = local_960 + 2;
        material.emission[1] = parseReal(&local_960,0.0);
      }
      else {
        iVar1 = strncmp(local_960,"illum",5);
        if ((iVar1 == 0) && ((local_960[5] == ' ' || (local_960[5] == '\t')))) {
          local_960 = local_960 + 6;
          material.ior = (real_t)parseInt(&local_960);
        }
        else if ((*local_960 == 'd') && ((local_960[1] == ' ' || (local_960[1] == '\t')))) {
          local_960 = local_960 + 1;
          material.shininess = parseReal(&local_960,0.0);
          if ((local_786 & 1) != 0) {
            poVar7 = std::operator<<(local_900,"Both `d` and `Tr` parameters defined for \"");
            poVar7 = std::operator<<(poVar7,(string *)local_778);
            poVar7 = std::operator<<(poVar7,"\". Use the value of `d` for dissolve (line ");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,linebuf.field_2._8_8_);
            poVar7 = std::operator<<(poVar7," in .mtl.)");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          }
          local_785 = 1;
        }
        else if ((*local_960 == 'T') &&
                ((local_960[1] == 'r' && ((local_960[2] == ' ' || (local_960[2] == '\t')))))) {
          local_960 = local_960 + 2;
          if ((local_785 & 1) == 0) {
            rVar8 = parseReal(&local_960,0.0);
            material.shininess = 1.0 - rVar8;
          }
          else {
            poVar7 = std::operator<<(local_900,"Both `d` and `Tr` parameters defined for \"");
            poVar7 = std::operator<<(poVar7,(string *)local_778);
            poVar7 = std::operator<<(poVar7,"\". Use the value of `d` for dissolve (line ");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,linebuf.field_2._8_8_);
            poVar7 = std::operator<<(poVar7," in .mtl.)");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          }
          local_786 = 1;
        }
        else if ((*local_960 == 'P') &&
                ((local_960[1] == 'r' && ((local_960[2] == ' ' || (local_960[2] == '\t')))))) {
          local_960 = local_960 + 2;
          material.reflection_texopt.colorspace.field_2._8_4_ = parseReal(&local_960,0.0);
        }
        else if ((*local_960 == 'P') &&
                ((local_960[1] == 'm' && ((local_960[2] == ' ' || (local_960[2] == '\t')))))) {
          local_960 = local_960 + 2;
          material.reflection_texopt.colorspace.field_2._12_4_ = parseReal(&local_960,0.0);
        }
        else if ((*local_960 == 'P') &&
                ((local_960[1] == 's' && ((local_960[2] == ' ' || (local_960[2] == '\t')))))) {
          local_960 = local_960 + 2;
          material.roughness = parseReal(&local_960,0.0);
        }
        else if ((*local_960 == 'P') &&
                ((local_960[1] == 'c' && ((local_960[2] == ' ' || (local_960[2] == '\t')))))) {
          local_960 = local_960 + 2;
          material.metallic = parseReal(&local_960,0.0);
        }
        else {
          iVar1 = strncmp(local_960,"Pcr",3);
          if ((iVar1 == 0) && ((local_960[3] == ' ' || (local_960[3] == '\t')))) {
            local_960 = local_960 + 4;
            material.sheen = parseReal(&local_960,0.0);
          }
          else {
            iVar1 = strncmp(local_960,"aniso",5);
            if ((iVar1 == 0) && ((local_960[5] == ' ' || (local_960[5] == '\t')))) {
              local_960 = local_960 + 6;
              material.clearcoat_thickness = parseReal(&local_960,0.0);
            }
            else {
              iVar1 = strncmp(local_960,"anisor",6);
              if ((iVar1 == 0) && ((local_960[6] == ' ' || (local_960[6] == '\t')))) {
                local_960 = local_960 + 7;
                material.clearcoat_roughness = parseReal(&local_960,0.0);
              }
              else {
                iVar1 = strncmp(local_960,"map_Ka",6);
                if ((iVar1 == 0) && ((local_960[6] == ' ' || (local_960[6] == '\t')))) {
                  local_960 = local_960 + 7;
                  ParseTextureNameAndOption
                            ((string *)&material.illum,
                             (texture_option_t *)((long)&material.reflection_texname.field_2 + 8),
                             local_960);
                }
                else {
                  iVar1 = strncmp(local_960,"map_Kd",6);
                  if ((iVar1 == 0) && ((local_960[6] == ' ' || (local_960[6] == '\t')))) {
                    local_960 = local_960 + 7;
                    ParseTextureNameAndOption
                              ((string *)((long)&material.ambient_texname.field_2 + 8),
                               (texture_option_t *)
                               ((long)&material.ambient_texopt.colorspace.field_2 + 8),local_960);
                    if ((local_787 & 1) == 0) {
                      material.ambient[1] = 0.6;
                      material.ambient[2] = 0.6;
                      material.diffuse[0] = 0.6;
                    }
                  }
                  else {
                    iVar1 = strncmp(local_960,"map_Ks",6);
                    if ((iVar1 == 0) && ((local_960[6] == ' ' || (local_960[6] == '\t')))) {
                      local_960 = local_960 + 7;
                      ParseTextureNameAndOption
                                ((string *)((long)&material.diffuse_texname.field_2 + 8),
                                 (texture_option_t *)
                                 ((long)&material.diffuse_texopt.colorspace.field_2 + 8),local_960);
                    }
                    else {
                      iVar1 = strncmp(local_960,"map_Ns",6);
                      if ((iVar1 == 0) && ((local_960[6] == ' ' || (local_960[6] == '\t')))) {
                        local_960 = local_960 + 7;
                        ParseTextureNameAndOption
                                  ((string *)((long)&material.specular_texname.field_2 + 8),
                                   (texture_option_t *)
                                   ((long)&material.specular_texopt.colorspace.field_2 + 8),
                                   local_960);
                      }
                      else {
                        iVar1 = strncmp(local_960,"map_bump",8);
                        if ((iVar1 == 0) && ((local_960[8] == ' ' || (local_960[8] == '\t')))) {
                          local_960 = local_960 + 9;
                          ParseTextureNameAndOption
                                    ((string *)
                                     ((long)&material.specular_highlight_texname.field_2 + 8),
                                     (texture_option_t *)
                                     ((long)&material.specular_highlight_texopt.colorspace.field_2 +
                                     8),local_960);
                        }
                        else {
                          iVar1 = strncmp(local_960,"map_Bump",8);
                          if ((iVar1 == 0) && ((local_960[8] == ' ' || (local_960[8] == '\t')))) {
                            local_960 = local_960 + 9;
                            ParseTextureNameAndOption
                                      ((string *)
                                       ((long)&material.specular_highlight_texname.field_2 + 8),
                                       (texture_option_t *)
                                       ((long)&material.specular_highlight_texopt.colorspace.field_2
                                       + 8),local_960);
                          }
                          else {
                            iVar1 = strncmp(local_960,"bump",4);
                            if ((iVar1 == 0) && ((local_960[4] == ' ' || (local_960[4] == '\t')))) {
                              local_960 = local_960 + 5;
                              ParseTextureNameAndOption
                                        ((string *)
                                         ((long)&material.specular_highlight_texname.field_2 + 8),
                                         (texture_option_t *)
                                         ((long)&material.specular_highlight_texopt.colorspace.
                                                 field_2 + 8),local_960);
                            }
                            else {
                              iVar1 = strncmp(local_960,"map_d",5);
                              if ((iVar1 == 0) && ((local_960[5] == ' ' || (local_960[5] == '\t'))))
                              {
                                local_960 = local_960 + 6;
                                std::__cxx11::string::operator=
                                          ((string *)
                                           (material.displacement_texname.field_2._M_local_buf + 8),
                                           local_960);
                                ParseTextureNameAndOption
                                          ((string *)
                                           ((long)&material.displacement_texname.field_2 + 8),
                                           (texture_option_t *)
                                           ((long)&material.displacement_texopt.colorspace.field_2 +
                                           8),local_960);
                              }
                              else {
                                iVar1 = strncmp(local_960,"disp",4);
                                if ((iVar1 == 0) &&
                                   ((local_960[4] == ' ' || (local_960[4] == '\t')))) {
                                  local_960 = local_960 + 5;
                                  ParseTextureNameAndOption
                                            ((string *)((long)&material.bump_texname.field_2 + 8),
                                             (texture_option_t *)
                                             ((long)&material.bump_texopt.colorspace.field_2 + 8),
                                             local_960);
                                }
                                else {
                                  iVar1 = strncmp(local_960,"refl",4);
                                  if ((iVar1 == 0) &&
                                     ((local_960[4] == ' ' || (local_960[4] == '\t')))) {
                                    local_960 = local_960 + 5;
                                    ParseTextureNameAndOption
                                              ((string *)((long)&material.alpha_texname.field_2 + 8)
                                               ,(texture_option_t *)
                                                ((long)&material.alpha_texopt.colorspace.field_2 + 8
                                                ),local_960);
                                  }
                                  else {
                                    iVar1 = strncmp(local_960,"map_Pr",6);
                                    if ((iVar1 == 0) &&
                                       ((local_960[6] == ' ' || (local_960[6] == '\t')))) {
                                      local_960 = local_960 + 7;
                                      ParseTextureNameAndOption
                                                ((string *)&material.anisotropy_rotation,
                                                 (texture_option_t *)
                                                 ((long)&material.normal_texname.field_2 + 8),
                                                 local_960);
                                    }
                                    else {
                                      iVar1 = strncmp(local_960,"map_Pm",6);
                                      if ((iVar1 == 0) &&
                                         ((local_960[6] == ' ' || (local_960[6] == '\t')))) {
                                        local_960 = local_960 + 7;
                                        ParseTextureNameAndOption
                                                  ((string *)
                                                   ((long)&material.roughness_texname.field_2 + 8),
                                                   (texture_option_t *)
                                                   ((long)&material.roughness_texopt.colorspace.
                                                           field_2 + 8),local_960);
                                      }
                                      else {
                                        iVar1 = strncmp(local_960,"map_Ps",6);
                                        if ((iVar1 == 0) &&
                                           ((local_960[6] == ' ' || (local_960[6] == '\t')))) {
                                          local_960 = local_960 + 7;
                                          ParseTextureNameAndOption
                                                    ((string *)
                                                     ((long)&material.metallic_texname.field_2 + 8),
                                                     (texture_option_t *)
                                                     ((long)&material.metallic_texopt.colorspace.
                                                             field_2 + 8),local_960);
                                        }
                                        else {
                                          iVar1 = strncmp(local_960,"map_Ke",6);
                                          if ((iVar1 == 0) &&
                                             ((local_960[6] == ' ' || (local_960[6] == '\t')))) {
                                            local_960 = local_960 + 7;
                                            ParseTextureNameAndOption
                                                      ((string *)
                                                       ((long)&material.sheen_texname.field_2 + 8),
                                                       (texture_option_t *)
                                                       ((long)&material.sheen_texopt.colorspace.
                                                               field_2 + 8),local_960);
                                          }
                                          else {
                                            iVar1 = strncmp(local_960,"norm",4);
                                            if ((iVar1 == 0) &&
                                               ((local_960[4] == ' ' || (local_960[4] == '\t')))) {
                                              local_960 = local_960 + 5;
                                              ParseTextureNameAndOption
                                                        ((string *)
                                                         ((long)&material.emissive_texname.field_2 +
                                                         8),(texture_option_t *)
                                                            ((long)&material.emissive_texopt.
                                                                    colorspace.field_2 + 8),
                                                         local_960);
                                            }
                                            else {
                                              len = (ptrdiff_t)strchr(local_960,0x20);
                                              if ((char *)len == (char *)0x0) {
                                                len = (ptrdiff_t)strchr(local_960,9);
                                              }
                                              pcVar3 = local_960;
                                              if (len != 0) {
                                                uVar4 = len - (long)local_960;
                                                key.field_2._8_8_ = uVar4;
                                                std::allocator<char>::allocator();
                                                std::__cxx11::string::string
                                                          ((string *)local_bb8,pcVar3,uVar4,
                                                           (allocator *)
                                                           (value.field_2._M_local_buf + 0xf));
                                                std::allocator<char>::~allocator
                                                          ((allocator<char> *)
                                                           (value.field_2._M_local_buf + 0xf));
                                                std::allocator<char>::allocator();
                                                std::__cxx11::string::string
                                                          ((string *)local_be0,(char *)(len + 1),
                                                           &local_be1);
                                                std::allocator<char>::~allocator
                                                          ((allocator<char> *)&local_be1);
                                                std::
                                                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                ::
                                                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                                                          (&local_c28,
                                                           (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_bb8,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_be0);
                                                _Var10 = std::
                                                  map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                                  ::
                                                  insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                                                            ((
                                                  map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                                  *)&material.pad2,&local_c28);
                                                local_c38 = (_Base_ptr)_Var10.first._M_node;
                                                local_c30 = _Var10.second;
                                                std::
                                                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                ::~pair(&local_c28);
                                                std::__cxx11::string::~string((string *)local_be0);
                                                std::__cxx11::string::~string((string *)local_bb8);
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("token",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/einsteinx2[P]glex/deps/shared/objl/tiny_obj_loader.h"
                ,0x6b3,
                "void tinyobj::LoadMtl(std::map<std::string, int> *, std::vector<material_t> *, std::istream *, std::string *, std::string *)"
               );
}

Assistant:

void LoadMtl(std::map<std::string, int> *material_map,
             std::vector<material_t> *materials, std::istream *inStream,
             std::string *warning, std::string *err) {
  (void)err;

  // Create a default material anyway.
  material_t material;
  InitMaterial(&material);

  // Issue 43. `d` wins against `Tr` since `Tr` is not in the MTL specification.
  bool has_d = false;
  bool has_tr = false;

  // has_kd is used to set a default diffuse value when map_Kd is present
  // and Kd is not.
  bool has_kd = false;

  std::stringstream warn_ss;

  size_t line_no = 0;
  std::string linebuf;
  while (inStream->peek() != -1) {
    safeGetline(*inStream, linebuf);
    line_no++;

    // Trim trailing whitespace.
    if (linebuf.size() > 0) {
      linebuf = linebuf.substr(0, linebuf.find_last_not_of(" \t") + 1);
    }

    // Trim newline '\r\n' or '\n'
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\n')
        linebuf.erase(linebuf.size() - 1);
    }
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\r')
        linebuf.erase(linebuf.size() - 1);
    }

    // Skip if empty line.
    if (linebuf.empty()) {
      continue;
    }

    // Skip leading space.
    const char *token = linebuf.c_str();
    token += strspn(token, " \t");

    assert(token);
    if (token[0] == '\0') continue;  // empty line

    if (token[0] == '#') continue;  // comment line

    // new mtl
    if ((0 == strncmp(token, "newmtl", 6)) && IS_SPACE((token[6]))) {
      // flush previous material.
      if (!material.name.empty()) {
        material_map->insert(std::pair<std::string, int>(
            material.name, static_cast<int>(materials->size())));
        materials->push_back(material);
      }

      // initial temporary material
      InitMaterial(&material);

      has_d = false;
      has_tr = false;

      // set new mtl name
      token += 7;
      {
        std::stringstream sstr;
        sstr << token;
        material.name = sstr.str();
      }
      continue;
    }

    // ambient
    if (token[0] == 'K' && token[1] == 'a' && IS_SPACE((token[2]))) {
      token += 2;
      real_t r, g, b;
      parseReal3(&r, &g, &b, &token);
      material.ambient[0] = r;
      material.ambient[1] = g;
      material.ambient[2] = b;
      continue;
    }

    // diffuse
    if (token[0] == 'K' && token[1] == 'd' && IS_SPACE((token[2]))) {
      token += 2;
      real_t r, g, b;
      parseReal3(&r, &g, &b, &token);
      material.diffuse[0] = r;
      material.diffuse[1] = g;
      material.diffuse[2] = b;
      has_kd = true;
      continue;
    }

    // specular
    if (token[0] == 'K' && token[1] == 's' && IS_SPACE((token[2]))) {
      token += 2;
      real_t r, g, b;
      parseReal3(&r, &g, &b, &token);
      material.specular[0] = r;
      material.specular[1] = g;
      material.specular[2] = b;
      continue;
    }

    // transmittance
    if ((token[0] == 'K' && token[1] == 't' && IS_SPACE((token[2]))) ||
        (token[0] == 'T' && token[1] == 'f' && IS_SPACE((token[2])))) {
      token += 2;
      real_t r, g, b;
      parseReal3(&r, &g, &b, &token);
      material.transmittance[0] = r;
      material.transmittance[1] = g;
      material.transmittance[2] = b;
      continue;
    }

    // ior(index of refraction)
    if (token[0] == 'N' && token[1] == 'i' && IS_SPACE((token[2]))) {
      token += 2;
      material.ior = parseReal(&token);
      continue;
    }

    // emission
    if (token[0] == 'K' && token[1] == 'e' && IS_SPACE(token[2])) {
      token += 2;
      real_t r, g, b;
      parseReal3(&r, &g, &b, &token);
      material.emission[0] = r;
      material.emission[1] = g;
      material.emission[2] = b;
      continue;
    }

    // shininess
    if (token[0] == 'N' && token[1] == 's' && IS_SPACE(token[2])) {
      token += 2;
      material.shininess = parseReal(&token);
      continue;
    }

    // illum model
    if (0 == strncmp(token, "illum", 5) && IS_SPACE(token[5])) {
      token += 6;
      material.illum = parseInt(&token);
      continue;
    }

    // dissolve
    if ((token[0] == 'd' && IS_SPACE(token[1]))) {
      token += 1;
      material.dissolve = parseReal(&token);

      if (has_tr) {
        warn_ss << "Both `d` and `Tr` parameters defined for \""
                << material.name
                << "\". Use the value of `d` for dissolve (line " << line_no
                << " in .mtl.)" << std::endl;
      }
      has_d = true;
      continue;
    }
    if (token[0] == 'T' && token[1] == 'r' && IS_SPACE(token[2])) {
      token += 2;
      if (has_d) {
        // `d` wins. Ignore `Tr` value.
        warn_ss << "Both `d` and `Tr` parameters defined for \""
                << material.name
                << "\". Use the value of `d` for dissolve (line " << line_no
                << " in .mtl.)" << std::endl;
      } else {
        // We invert value of Tr(assume Tr is in range [0, 1])
        // NOTE: Interpretation of Tr is application(exporter) dependent. For
        // some application(e.g. 3ds max obj exporter), Tr = d(Issue 43)
        material.dissolve = static_cast<real_t>(1.0) - parseReal(&token);
      }
      has_tr = true;
      continue;
    }

    // PBR: roughness
    if (token[0] == 'P' && token[1] == 'r' && IS_SPACE(token[2])) {
      token += 2;
      material.roughness = parseReal(&token);
      continue;
    }

    // PBR: metallic
    if (token[0] == 'P' && token[1] == 'm' && IS_SPACE(token[2])) {
      token += 2;
      material.metallic = parseReal(&token);
      continue;
    }

    // PBR: sheen
    if (token[0] == 'P' && token[1] == 's' && IS_SPACE(token[2])) {
      token += 2;
      material.sheen = parseReal(&token);
      continue;
    }

    // PBR: clearcoat thickness
    if (token[0] == 'P' && token[1] == 'c' && IS_SPACE(token[2])) {
      token += 2;
      material.clearcoat_thickness = parseReal(&token);
      continue;
    }

    // PBR: clearcoat roughness
    if ((0 == strncmp(token, "Pcr", 3)) && IS_SPACE(token[3])) {
      token += 4;
      material.clearcoat_roughness = parseReal(&token);
      continue;
    }

    // PBR: anisotropy
    if ((0 == strncmp(token, "aniso", 5)) && IS_SPACE(token[5])) {
      token += 6;
      material.anisotropy = parseReal(&token);
      continue;
    }

    // PBR: anisotropy rotation
    if ((0 == strncmp(token, "anisor", 6)) && IS_SPACE(token[6])) {
      token += 7;
      material.anisotropy_rotation = parseReal(&token);
      continue;
    }

    // ambient texture
    if ((0 == strncmp(token, "map_Ka", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.ambient_texname),
                                &(material.ambient_texopt), token);
      continue;
    }

    // diffuse texture
    if ((0 == strncmp(token, "map_Kd", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.diffuse_texname),
                                &(material.diffuse_texopt), token);

      // Set a decent diffuse default value if a diffuse texture is specified
      // without a matching Kd value.
      if (!has_kd)
      {
        material.diffuse[0] = static_cast<real_t>(0.6);
        material.diffuse[1] = static_cast<real_t>(0.6);
        material.diffuse[2] = static_cast<real_t>(0.6);
      }

      continue;
    }

    // specular texture
    if ((0 == strncmp(token, "map_Ks", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.specular_texname),
                                &(material.specular_texopt), token);
      continue;
    }

    // specular highlight texture
    if ((0 == strncmp(token, "map_Ns", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.specular_highlight_texname),
                                &(material.specular_highlight_texopt), token);
      continue;
    }

    // bump texture
    if ((0 == strncmp(token, "map_bump", 8)) && IS_SPACE(token[8])) {
      token += 9;
      ParseTextureNameAndOption(&(material.bump_texname),
                                &(material.bump_texopt), token);
      continue;
    }

    // bump texture
    if ((0 == strncmp(token, "map_Bump", 8)) && IS_SPACE(token[8])) {
      token += 9;
      ParseTextureNameAndOption(&(material.bump_texname),
                                &(material.bump_texopt), token);
      continue;
    }

    // bump texture
    if ((0 == strncmp(token, "bump", 4)) && IS_SPACE(token[4])) {
      token += 5;
      ParseTextureNameAndOption(&(material.bump_texname),
                                &(material.bump_texopt), token);
      continue;
    }

    // alpha texture
    if ((0 == strncmp(token, "map_d", 5)) && IS_SPACE(token[5])) {
      token += 6;
      material.alpha_texname = token;
      ParseTextureNameAndOption(&(material.alpha_texname),
                                &(material.alpha_texopt), token);
      continue;
    }

    // displacement texture
    if ((0 == strncmp(token, "disp", 4)) && IS_SPACE(token[4])) {
      token += 5;
      ParseTextureNameAndOption(&(material.displacement_texname),
                                &(material.displacement_texopt), token);
      continue;
    }

    // reflection map
    if ((0 == strncmp(token, "refl", 4)) && IS_SPACE(token[4])) {
      token += 5;
      ParseTextureNameAndOption(&(material.reflection_texname),
                                &(material.reflection_texopt), token);
      continue;
    }

    // PBR: roughness texture
    if ((0 == strncmp(token, "map_Pr", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.roughness_texname),
                                &(material.roughness_texopt), token);
      continue;
    }

    // PBR: metallic texture
    if ((0 == strncmp(token, "map_Pm", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.metallic_texname),
                                &(material.metallic_texopt), token);
      continue;
    }

    // PBR: sheen texture
    if ((0 == strncmp(token, "map_Ps", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.sheen_texname),
                                &(material.sheen_texopt), token);
      continue;
    }

    // PBR: emissive texture
    if ((0 == strncmp(token, "map_Ke", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.emissive_texname),
                                &(material.emissive_texopt), token);
      continue;
    }

    // PBR: normal map texture
    if ((0 == strncmp(token, "norm", 4)) && IS_SPACE(token[4])) {
      token += 5;
      ParseTextureNameAndOption(&(material.normal_texname),
                                &(material.normal_texopt), token);
      continue;
    }

    // unknown parameter
    const char *_space = strchr(token, ' ');
    if (!_space) {
      _space = strchr(token, '\t');
    }
    if (_space) {
      std::ptrdiff_t len = _space - token;
      std::string key(token, static_cast<size_t>(len));
      std::string value = _space + 1;
      material.unknown_parameter.insert(
          std::pair<std::string, std::string>(key, value));
    }
  }
  // flush last material.
  material_map->insert(std::pair<std::string, int>(
      material.name, static_cast<int>(materials->size())));
  materials->push_back(material);

  if (warning) {
    (*warning) = warn_ss.str();
  }
}